

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

void htmlDocContentDumpFormatOutput(xmlOutputBufferPtr buf,xmlDocPtr cur,char *encoding,int format)

{
  xmlElementType local_28;
  int type;
  int format_local;
  char *encoding_local;
  xmlDocPtr cur_local;
  xmlOutputBufferPtr buf_local;
  
  local_28 = 0;
  if (cur != (xmlDocPtr)0x0) {
    local_28 = cur->type;
    cur->type = XML_HTML_DOCUMENT_NODE;
  }
  htmlNodeDumpFormatOutput(buf,cur,(xmlNodePtr)cur,(char *)0x0,format);
  if (cur != (xmlDocPtr)0x0) {
    cur->type = local_28;
  }
  return;
}

Assistant:

void
htmlDocContentDumpFormatOutput(xmlOutputBufferPtr buf, xmlDocPtr cur,
	                       const char *encoding ATTRIBUTE_UNUSED,
                               int format) {
    int type = 0;
    if (cur) {
        type = cur->type;
        cur->type = XML_HTML_DOCUMENT_NODE;
    }
    htmlNodeDumpFormatOutput(buf, cur, (xmlNodePtr) cur, NULL, format);
    if (cur)
        cur->type = (xmlElementType) type;
}